

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_OneofInequalityTest_Test::TestBody
          (MessageDifferencerTest_OneofInequalityTest_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_90 [8];
  TestOneof2 msg2;
  TestOneof2 msg1;
  MessageDifferencerTest_OneofInequalityTest_Test *this_local;
  
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&msg2.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_90);
  TestUtil::SetOneof1<proto2_unittest::TestOneof2>((TestOneof2 *)((long)&msg2.field_0 + 0x28));
  TestUtil::SetOneof2<proto2_unittest::TestOneof2>((TestOneof2 *)local_90);
  bVar1 = util::MessageDifferencer::Equals
                    ((Message *)((long)&msg2.field_0 + 0x28),(Message *)local_90);
  local_b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)local_b0,
               (AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x4c4,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_90);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&msg2.field_0 + 0x28));
  return;
}

Assistant:

TEST(MessageDifferencerTest, OneofInequalityTest) {
  // Create the testing protos
  unittest::TestOneof2 msg1;
  unittest::TestOneof2 msg2;

  TestUtil::SetOneof1(&msg1);
  TestUtil::SetOneof2(&msg2);

  // Compare
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
}